

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf16sDfa.h
# Opt level: O0

Utf16sDfaBase<axl::enc::Utf16sDfaTable> __thiscall
axl::enc::Utf16sDfaBase<axl::enc::Utf16sDfaTable>::decode
          (Utf16sDfaBase<axl::enc::Utf16sDfaTable> *this,uchar_t c)

{
  byte bVar1;
  ushort uVar2;
  byte in_SIL;
  int *in_RDI;
  utf16_t cu;
  utf32_t cp;
  uint_t nextState;
  uint_t cc;
  uint in_stack_ffffffffffffffd8;
  uint_t in_stack_ffffffffffffffdc;
  uint uVar3;
  Utf16sDfaTable local_8;
  
  bVar1 = Utf16sDfaTable::m_dfa[*in_RDI + (uint)(byte)Utf16CcMap::m_map[in_SIL]];
  uVar3 = in_RDI[1];
  if (bVar1 < 0x11) {
    uVar3 = (uint)in_SIL << 0x10 | uVar3 & 0xffff;
  }
  else {
    uVar2 = (ushort)(uVar3 >> 0x10) | (ushort)in_SIL << 8;
    in_stack_ffffffffffffffdc = CONCAT22(uVar2,(short)in_stack_ffffffffffffffdc);
    if (bVar1 == 0x28) {
      in_stack_ffffffffffffffd8 = (uVar3 & 0xffff) * 0x400 + -0x35fdc00 + (int)(short)uVar2;
      uVar3 = in_stack_ffffffffffffffd8;
    }
    else {
      in_stack_ffffffffffffffd8 = (uint)(short)uVar2;
      uVar3 = in_stack_ffffffffffffffd8;
    }
  }
  Utf16sDfaBase((Utf16sDfaBase<axl::enc::Utf16sDfaTable> *)(ulong)CONCAT14(bVar1,uVar3),
                in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  return (Utf16sDfaBase<axl::enc::Utf16sDfaTable>)
         local_8.super_UtfDfa<axl::enc::Utf16sDfaTable,_axl::enc::Utf16CcMap>;
}

Assistant:

Utf16sDfaBase<DfaTable>
Utf16sDfaBase<DfaTable>::decode(uchar_t c) {
	uint_t cc = DfaTable::m_map[c];
	uint_t nextState = DfaTable::m_dfa[this->m_state + cc];
	utf32_t cp = this->m_cp;

	if (nextState <= DfaTable::State_LastHalf) { // half of the next code-unit
		cp &= 0x0000ffff; // use this byte for storage: 0x00ff0000
		cp |= c << 16;
	} else {
		utf16_t cu = DfaTable::IsBigEndian ?
			((cp >> 8) & 0xff00) | c :
			(cp >> 16) | (c << 8);

		cp = nextState == DfaTable::State_ReadyPair ? DfaTable::IsReverse ?
			0x10000 - (0xd800 << 10) - 0xdc00 + (cu << 10) + (cp & 0xffff) :
			0x10000 - (0xd800 << 10) - 0xdc00 + ((cp & 0xffff) << 10) + cu :
			cu;
	}

	return Utf16sDfaBase<DfaTable>(nextState, cp);
}